

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

void __thiscall
EDCircles::DetectArcs(EDCircles *this,vector<LineSegment,_std::allocator<LineSegment>_> *lines)

{
  Info *pIVar1;
  pointer pLVar2;
  BufferManager *pBVar3;
  pointer pvVar4;
  Circle *pCVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  bool bVar24;
  double dVar25;
  double dVar26;
  bool bVar27;
  double *x;
  long lVar28;
  int m;
  int iVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  bool *pbVar36;
  int *piVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  int iVar41;
  int iVar42;
  ulong uVar43;
  bool bVar44;
  bool bVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double dVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  int iVar113;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  double *local_160;
  int *local_140;
  long local_138;
  double eTheta;
  double eTheta_1;
  int local_ec;
  double yc_1;
  double xc_1;
  double yc;
  double xc;
  double error;
  double Error;
  ulong local_b8;
  double r;
  double circleFitError;
  double radius;
  double sTheta;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  int *local_58;
  double local_50;
  double local_48;
  long local_40;
  ulong local_38;
  
  iVar54 = (this->super_EDPF).super_ED.width;
  iVar39 = (this->super_EDPF).super_ED.height;
  if (iVar39 < iVar54) {
    iVar39 = iVar54;
  }
  local_b8 = (ulong)(uint)(iVar39 / 5);
  local_58 = &this->noCircles1;
  iVar54 = (this->super_EDPF).super_ED.segmentNos;
  local_ec = 1;
  auVar49 = ZEXT816(0x3ff0c152382d7365);
  do {
    auVar56 = ZEXT816(0x3ffa749cc47da8bb);
    if (local_ec != 2) {
      auVar56 = auVar49;
    }
    auVar49 = auVar56;
    if (0 < iVar54) {
      lVar28 = 0;
      local_38 = auVar49._0_8_;
      do {
        iVar39 = this->segmentStartLines[lVar28];
        iVar34 = this->segmentStartLines[lVar28 + 1];
        if (1 < iVar34 - iVar39) {
          lVar35 = (long)iVar34 + -1;
          iVar34 = (int)lVar35;
          if (iVar39 < iVar34) {
            local_40 = -lVar35;
            do {
              pIVar1 = this->info;
              lVar40 = (long)iVar39;
              if (pIVar1[lVar40].taken == true) {
LAB_0010b2f6:
                iVar41 = iVar39 + 1;
              }
              else {
                pLVar2 = (lines->super__Vector_base<LineSegment,_std::allocator<LineSegment>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                iVar54 = pLVar2[lVar40].len;
                if ((int)local_b8 <= iVar54) goto LAB_0010b2f6;
                dVar48 = pIVar1[lVar40].angle;
                iVar41 = iVar39 + 1;
                if ((0.10471975511965977 <= dVar48) && (dVar58 = auVar49._0_8_, dVar48 <= dVar58)) {
                  iVar32 = iVar41;
                  if (iVar41 < iVar34) {
                    lVar33 = (long)iVar41;
                    pbVar36 = &pIVar1[lVar33].taken;
                    piVar37 = &pLVar2[lVar33].len;
                    lVar30 = 0;
                    do {
                      if ((((*pbVar36 != false) ||
                           (((Info *)(pbVar36 + -0x10))->sign != pIVar1[lVar40].sign)) ||
                          ((int)local_b8 <= *piVar37)) ||
                         ((*(double *)(pbVar36 + -8) < 0.10471975511965977 ||
                          (dVar58 < *(double *)(pbVar36 + -8))))) {
                        iVar32 = iVar41 - (int)lVar30;
                        break;
                      }
                      lVar30 = lVar30 + -1;
                      pbVar36 = pbVar36 + 0x18;
                      piVar37 = piVar37 + 0x12;
                      iVar32 = iVar34;
                    } while (lVar33 + local_40 != lVar30);
                  }
                  uVar43 = 0;
                  bVar45 = false;
                  bVar44 = iVar32 - iVar39 == 1;
                  if (bVar44) {
                    if (0.2617993877991494 <= dVar48) {
                      iVar41 = pLVar2[iVar41].len;
                      iVar29 = iVar54;
                      if (iVar41 < iVar54) {
                        iVar29 = iVar41;
                      }
                      iVar42 = iVar54;
                      if (iVar54 < iVar41) {
                        iVar42 = iVar41;
                      }
                      if (((dVar48 <= 0.7853981633974483) && (0x27 < iVar41 + iVar54)) &&
                         (iVar42 <= iVar29 * 2)) {
                        bVar45 = false;
                        goto LAB_0010b4c1;
                      }
                    }
                    if (((iVar39 != this->segmentStartLines[lVar28]) ||
                        (pIVar1[lVar35].angle < 0.10471975511965977)) ||
                       (dVar58 < pIVar1[lVar35].angle)) {
                      iVar41 = iVar32;
                      if (((iVar32 != iVar34) || (pIVar1[lVar35].angle < 0.10471975511965977)) ||
                         (bVar45 = true, dVar58 < pIVar1[lVar35].angle)) goto LAB_0010b2fb;
                      goto LAB_0010b4c1;
                    }
                    pBVar3 = this->bm;
                    local_140 = &pBVar3->index;
                    iVar54 = pBVar3->index;
                    x = pBVar3->x + iVar54;
                    local_160 = pBVar3->y + iVar54;
                    uVar43 = (ulong)pLVar2[lVar35].len;
                    bVar24 = true;
                    if ((long)uVar43 < 1) {
                      bVar45 = false;
                      bVar44 = true;
                      uVar43 = 0;
                    }
                    else {
                      lVar30 = *(long *)&(this->super_EDPF).super_ED.segmentPoints.
                                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar28].
                                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                         ._M_impl.super__Vector_impl_data +
                               (long)pLVar2[lVar35].firstPixelIndex * 8;
                      uVar31 = 0;
                      do {
                        x[uVar31] = (double)*(int *)(lVar30 + uVar31 * 8);
                        local_160[uVar31] = (double)*(int *)(lVar30 + 4 + uVar31 * 8);
                        uVar31 = uVar31 + 1;
                      } while (uVar43 != uVar31);
                      bVar45 = false;
                      bVar44 = true;
                    }
                  }
                  else {
LAB_0010b4c1:
                    pBVar3 = this->bm;
                    local_140 = &pBVar3->index;
                    iVar54 = pBVar3->index;
                    x = pBVar3->x + iVar54;
                    local_160 = pBVar3->y + iVar54;
                    bVar24 = false;
                  }
                  iVar41 = (int)uVar43;
                  if (iVar39 <= iVar32) {
                    pvVar4 = (this->super_EDPF).super_ED.segmentPoints.
                             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    lVar30 = lVar40;
                    do {
                      iVar41 = pLVar2[lVar30].len;
                      if (0 < (long)iVar41) {
                        iVar29 = (int)uVar43;
                        lVar33 = *(long *)&pvVar4[lVar28].
                                           super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                           ._M_impl.super__Vector_impl_data + 4 +
                                 (long)pLVar2[lVar30].firstPixelIndex * 8;
                        lVar38 = 0;
                        do {
                          x[iVar29 + lVar38] = (double)*(int *)(lVar33 + -4 + lVar38 * 8);
                          local_160[iVar29 + lVar38] = (double)*(int *)(lVar33 + lVar38 * 8);
                          lVar38 = lVar38 + 1;
                        } while (iVar41 != lVar38);
                        uVar43 = (ulong)(uint)(iVar29 + (int)lVar38);
                      }
                      iVar41 = (int)uVar43;
                      lVar30 = lVar30 + 1;
                    } while (iVar32 + 1 != (int)lVar30);
                  }
                  if (bVar45) {
                    iVar29 = pLVar2[this->segmentStartLines[lVar28]].len;
                    if (0 < (long)iVar29) {
                      lVar30 = *(long *)&(this->super_EDPF).super_ED.segmentPoints.
                                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar28].
                                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                         ._M_impl.super__Vector_impl_data +
                               (long)pLVar2[this->segmentStartLines[lVar28]].firstPixelIndex * 8;
                      lVar33 = 0;
                      do {
                        x[iVar41 + lVar33] = (double)*(int *)(lVar30 + lVar33 * 8);
                        local_160[iVar41 + lVar33] = (double)*(int *)(lVar30 + 4 + lVar33 * 8);
                        lVar33 = lVar33 + 1;
                      } while (iVar29 != lVar33);
                      iVar41 = iVar41 + (int)lVar33;
                    }
                  }
                  *local_140 = iVar54 + iVar41;
                  CircleFit(x,local_160,iVar41,&xc,&yc,&radius,&circleFitError);
                  dVar26 = radius;
                  dVar25 = circleFitError;
                  dVar58 = xc;
                  dVar48 = yc;
                  dVar46 = (double)iVar41 / (radius * 6.283185307179586);
                  if ((bool)(dVar46 < 0.0625 & bVar44)) {
                    this->info[lVar40].taken = true;
                  }
                  else {
                    iVar54 = (int)lVar28;
                    if (circleFitError <=
                        *(double *)(&DAT_0011b450 + (ulong)(2 < iVar32 - iVar39) * 8)) {
                      if (bVar24) {
                        iVar29 = (lines->
                                 super__Vector_base<LineSegment,_std::allocator<LineSegment>_>).
                                 _M_impl.super__Vector_impl_data._M_start[lVar35].len;
                        x = x + iVar29;
                        local_160 = local_160 + iVar29;
                        iVar41 = iVar41 - iVar29;
                      }
                      else if (bVar45) {
                        iVar41 = iVar41 - (lines->
                                          super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                                          )._M_impl.super__Vector_impl_data._M_start
                                          [this->segmentStartLines[lVar28]].len;
                      }
                      if ((dVar46 < 0.67) || (1.5 < circleFitError)) {
                        ComputeStartAndEndAngles(xc,yc,radius,x,local_160,iVar41,&sTheta,&eTheta);
                        addArc(this->edarcs1->arcs,&this->edarcs1->noArcs,dVar58,dVar48,dVar26,
                               dVar25,sTheta,eTheta,this->info[lVar40].sign,iVar54,(int)*x,
                               (int)*local_160,(int)x[(long)iVar41 + -1],
                               (int)local_160[(long)iVar41 + -1],x,local_160,iVar41,in_XMM6._0_8_);
                      }
                      else {
                        pCVar5 = this->circles1;
                        iVar54 = this->noCircles1;
                        pCVar5[iVar54].xc = xc;
                        pCVar5[iVar54].yc = yc;
                        pCVar5[iVar54].r = radius;
                        pCVar5[iVar54].circleFitError = circleFitError;
                        pCVar5[iVar54].coverRatio = (double)iVar41 / (radius * 6.283185307179586);
                        pCVar5[iVar54].x = x;
                        pCVar5[iVar54].y = local_160;
                        pCVar5[iVar54].noPixels = iVar41;
                        iVar54 = this->noCircles1;
                        pCVar5[iVar54].isEllipse = false;
                        this->noCircles1 = iVar54 + 1;
                      }
                      auVar49 = _DAT_0011b240;
                      if (iVar39 < iVar32) {
                        lVar30 = (iVar32 - lVar40) + -1;
                        auVar56._8_4_ = (int)lVar30;
                        auVar56._0_8_ = lVar30;
                        auVar56._12_4_ = (int)((ulong)lVar30 >> 0x20);
                        pbVar36 = &this->info[lVar40 + 0xf].taken;
                        uVar43 = 0;
                        do {
                          auVar122._8_4_ = (int)uVar43;
                          auVar122._0_8_ = uVar43;
                          auVar122._12_4_ = (int)(uVar43 >> 0x20);
                          auVar73 = auVar56 ^ auVar49;
                          auVar77 = (auVar122 | _DAT_0011b4d0) ^ auVar49;
                          iVar54 = auVar73._0_4_;
                          iVar42 = -(uint)(iVar54 < auVar77._0_4_);
                          iVar39 = auVar73._4_4_;
                          auVar100._4_4_ = -(uint)(iVar39 < auVar77._4_4_);
                          iVar41 = auVar73._8_4_;
                          iVar113 = -(uint)(iVar41 < auVar77._8_4_);
                          iVar29 = auVar73._12_4_;
                          auVar100._12_4_ = -(uint)(iVar29 < auVar77._12_4_);
                          auVar64._4_4_ = iVar42;
                          auVar64._0_4_ = iVar42;
                          auVar64._8_4_ = iVar113;
                          auVar64._12_4_ = iVar113;
                          auVar114 = pshuflw(in_XMM6,auVar64,0xe8);
                          auVar78._4_4_ = -(uint)(auVar77._4_4_ == iVar39);
                          auVar78._12_4_ = -(uint)(auVar77._12_4_ == iVar29);
                          auVar78._0_4_ = auVar78._4_4_;
                          auVar78._8_4_ = auVar78._12_4_;
                          auVar121 = pshuflw(in_XMM7,auVar78,0xe8);
                          auVar100._0_4_ = auVar100._4_4_;
                          auVar100._8_4_ = auVar100._12_4_;
                          auVar77 = pshuflw(auVar114,auVar100,0xe8);
                          auVar73._8_4_ = 0xffffffff;
                          auVar73._0_8_ = 0xffffffffffffffff;
                          auVar73._12_4_ = 0xffffffff;
                          auVar73 = (auVar77 | auVar121 & auVar114) ^ auVar73;
                          auVar73 = packssdw(auVar73,auVar73);
                          if ((auVar73 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                            pbVar36[-0x168] = true;
                          }
                          auVar100 = auVar78 & auVar64 | auVar100;
                          auVar73 = packssdw(auVar100,auVar100);
                          auVar77._8_4_ = 0xffffffff;
                          auVar77._0_8_ = 0xffffffffffffffff;
                          auVar77._12_4_ = 0xffffffff;
                          auVar73 = packssdw(auVar73 ^ auVar77,auVar73 ^ auVar77);
                          auVar73 = packsswb(auVar73,auVar73);
                          if ((auVar73._0_4_ >> 8 & 1) != 0) {
                            pbVar36[-0x150] = true;
                          }
                          auVar73 = (auVar122 | _DAT_0011b4c0) ^ auVar49;
                          iVar42 = -(uint)(iVar54 < auVar73._0_4_);
                          auVar107._4_4_ = -(uint)(iVar39 < auVar73._4_4_);
                          iVar113 = -(uint)(iVar41 < auVar73._8_4_);
                          auVar107._12_4_ = -(uint)(iVar29 < auVar73._12_4_);
                          auVar59._4_4_ = iVar42;
                          auVar59._0_4_ = iVar42;
                          auVar59._8_4_ = iVar113;
                          auVar59._12_4_ = iVar113;
                          auVar91._4_4_ = -(uint)(auVar73._4_4_ == iVar39);
                          auVar91._12_4_ = -(uint)(auVar73._12_4_ == iVar29);
                          auVar91._0_4_ = auVar91._4_4_;
                          auVar91._8_4_ = auVar91._12_4_;
                          auVar107._0_4_ = auVar107._4_4_;
                          auVar107._8_4_ = auVar107._12_4_;
                          auVar73 = auVar91 & auVar59 | auVar107;
                          auVar73 = packssdw(auVar73,auVar73);
                          auVar17._8_4_ = 0xffffffff;
                          auVar17._0_8_ = 0xffffffffffffffff;
                          auVar17._12_4_ = 0xffffffff;
                          auVar73 = packssdw(auVar73 ^ auVar17,auVar73 ^ auVar17);
                          auVar73 = packsswb(auVar73,auVar73);
                          if ((auVar73._0_4_ >> 0x10 & 1) != 0) {
                            pbVar36[-0x138] = true;
                          }
                          auVar77 = pshufhw(auVar59,auVar59,0x84);
                          auVar100 = pshufhw(auVar91,auVar91,0x84);
                          auVar78 = pshufhw(auVar77,auVar107,0x84);
                          auVar60._8_4_ = 0xffffffff;
                          auVar60._0_8_ = 0xffffffffffffffff;
                          auVar60._12_4_ = 0xffffffff;
                          auVar60 = (auVar78 | auVar100 & auVar77) ^ auVar60;
                          auVar77 = packssdw(auVar60,auVar60);
                          auVar77 = packsswb(auVar77,auVar77);
                          if ((auVar77._0_4_ >> 0x18 & 1) != 0) {
                            pbVar36[-0x120] = true;
                          }
                          auVar77 = (auVar122 | _DAT_0011b4b0) ^ auVar49;
                          iVar42 = -(uint)(iVar54 < auVar77._0_4_);
                          auVar62._4_4_ = -(uint)(iVar39 < auVar77._4_4_);
                          iVar113 = -(uint)(iVar41 < auVar77._8_4_);
                          auVar62._12_4_ = -(uint)(iVar29 < auVar77._12_4_);
                          auVar92._4_4_ = iVar42;
                          auVar92._0_4_ = iVar42;
                          auVar92._8_4_ = iVar113;
                          auVar92._12_4_ = iVar113;
                          auVar73 = pshuflw(auVar73,auVar92,0xe8);
                          auVar61._4_4_ = -(uint)(auVar77._4_4_ == iVar39);
                          auVar61._12_4_ = -(uint)(auVar77._12_4_ == iVar29);
                          auVar61._0_4_ = auVar61._4_4_;
                          auVar61._8_4_ = auVar61._12_4_;
                          auVar78 = pshuflw(auVar121 & auVar114,auVar61,0xe8);
                          auVar62._0_4_ = auVar62._4_4_;
                          auVar62._8_4_ = auVar62._12_4_;
                          auVar77 = pshuflw(auVar73,auVar62,0xe8);
                          auVar114._8_4_ = 0xffffffff;
                          auVar114._0_8_ = 0xffffffffffffffff;
                          auVar114._12_4_ = 0xffffffff;
                          auVar114 = (auVar77 | auVar78 & auVar73) ^ auVar114;
                          auVar77 = packssdw(auVar114,auVar114);
                          auVar77 = packsswb(auVar77,auVar77);
                          if ((auVar77 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                            pbVar36[-0x108] = true;
                          }
                          auVar62 = auVar61 & auVar92 | auVar62;
                          auVar77 = packssdw(auVar62,auVar62);
                          auVar121._8_4_ = 0xffffffff;
                          auVar121._0_8_ = 0xffffffffffffffff;
                          auVar121._12_4_ = 0xffffffff;
                          auVar77 = packssdw(auVar77 ^ auVar121,auVar77 ^ auVar121);
                          auVar77 = packsswb(auVar77,auVar77);
                          if ((auVar77._4_2_ >> 8 & 1) != 0) {
                            pbVar36[-0xf0] = true;
                          }
                          auVar77 = (auVar122 | _DAT_0011b4a0) ^ auVar49;
                          iVar42 = -(uint)(iVar54 < auVar77._0_4_);
                          auVar108._4_4_ = -(uint)(iVar39 < auVar77._4_4_);
                          iVar113 = -(uint)(iVar41 < auVar77._8_4_);
                          auVar108._12_4_ = -(uint)(iVar29 < auVar77._12_4_);
                          auVar63._4_4_ = iVar42;
                          auVar63._0_4_ = iVar42;
                          auVar63._8_4_ = iVar113;
                          auVar63._12_4_ = iVar113;
                          auVar93._4_4_ = -(uint)(auVar77._4_4_ == iVar39);
                          auVar93._12_4_ = -(uint)(auVar77._12_4_ == iVar29);
                          auVar93._0_4_ = auVar93._4_4_;
                          auVar93._8_4_ = auVar93._12_4_;
                          auVar108._0_4_ = auVar108._4_4_;
                          auVar108._8_4_ = auVar108._12_4_;
                          auVar77 = auVar93 & auVar63 | auVar108;
                          auVar77 = packssdw(auVar77,auVar77);
                          auVar18._8_4_ = 0xffffffff;
                          auVar18._0_8_ = 0xffffffffffffffff;
                          auVar18._12_4_ = 0xffffffff;
                          auVar77 = packssdw(auVar77 ^ auVar18,auVar77 ^ auVar18);
                          auVar77 = packsswb(auVar77,auVar77);
                          if ((auVar77 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0
                             ) {
                            pbVar36[-0xd8] = true;
                          }
                          auVar100 = pshufhw(auVar63,auVar63,0x84);
                          auVar114 = pshufhw(auVar93,auVar93,0x84);
                          auVar64 = pshufhw(auVar100,auVar108,0x84);
                          auVar65._8_4_ = 0xffffffff;
                          auVar65._0_8_ = 0xffffffffffffffff;
                          auVar65._12_4_ = 0xffffffff;
                          auVar65 = (auVar64 | auVar114 & auVar100) ^ auVar65;
                          auVar100 = packssdw(auVar65,auVar65);
                          auVar100 = packsswb(auVar100,auVar100);
                          if ((auVar100._6_2_ >> 8 & 1) != 0) {
                            pbVar36[-0xc0] = true;
                          }
                          auVar100 = (auVar122 | _DAT_0011b490) ^ auVar49;
                          iVar42 = -(uint)(iVar54 < auVar100._0_4_);
                          auVar67._4_4_ = -(uint)(iVar39 < auVar100._4_4_);
                          iVar113 = -(uint)(iVar41 < auVar100._8_4_);
                          auVar67._12_4_ = -(uint)(iVar29 < auVar100._12_4_);
                          auVar94._4_4_ = iVar42;
                          auVar94._0_4_ = iVar42;
                          auVar94._8_4_ = iVar113;
                          auVar94._12_4_ = iVar113;
                          auVar77 = pshuflw(auVar77,auVar94,0xe8);
                          auVar66._4_4_ = -(uint)(auVar100._4_4_ == iVar39);
                          auVar66._12_4_ = -(uint)(auVar100._12_4_ == iVar29);
                          auVar66._0_4_ = auVar66._4_4_;
                          auVar66._8_4_ = auVar66._12_4_;
                          auVar78 = pshuflw(auVar78 & auVar73,auVar66,0xe8);
                          auVar67._0_4_ = auVar67._4_4_;
                          auVar67._8_4_ = auVar67._12_4_;
                          auVar73 = pshuflw(auVar77,auVar67,0xe8);
                          auVar115._8_4_ = 0xffffffff;
                          auVar115._0_8_ = 0xffffffffffffffff;
                          auVar115._12_4_ = 0xffffffff;
                          auVar115 = (auVar73 | auVar78 & auVar77) ^ auVar115;
                          auVar73 = packssdw(auVar115,auVar115);
                          auVar73 = packsswb(auVar73,auVar73);
                          if ((auVar73 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                            pbVar36[-0xa8] = true;
                          }
                          auVar67 = auVar66 & auVar94 | auVar67;
                          auVar73 = packssdw(auVar67,auVar67);
                          auVar19._8_4_ = 0xffffffff;
                          auVar19._0_8_ = 0xffffffffffffffff;
                          auVar19._12_4_ = 0xffffffff;
                          auVar73 = packssdw(auVar73 ^ auVar19,auVar73 ^ auVar19);
                          auVar73 = packsswb(auVar73,auVar73);
                          if ((auVar73._8_2_ >> 8 & 1) != 0) {
                            pbVar36[-0x90] = true;
                          }
                          auVar73 = (auVar122 | _DAT_0011b480) ^ auVar49;
                          iVar42 = -(uint)(iVar54 < auVar73._0_4_);
                          auVar109._4_4_ = -(uint)(iVar39 < auVar73._4_4_);
                          iVar113 = -(uint)(iVar41 < auVar73._8_4_);
                          auVar109._12_4_ = -(uint)(iVar29 < auVar73._12_4_);
                          auVar68._4_4_ = iVar42;
                          auVar68._0_4_ = iVar42;
                          auVar68._8_4_ = iVar113;
                          auVar68._12_4_ = iVar113;
                          auVar95._4_4_ = -(uint)(auVar73._4_4_ == iVar39);
                          auVar95._12_4_ = -(uint)(auVar73._12_4_ == iVar29);
                          auVar95._0_4_ = auVar95._4_4_;
                          auVar95._8_4_ = auVar95._12_4_;
                          auVar109._0_4_ = auVar109._4_4_;
                          auVar109._8_4_ = auVar109._12_4_;
                          auVar73 = auVar95 & auVar68 | auVar109;
                          auVar73 = packssdw(auVar73,auVar73);
                          auVar20._8_4_ = 0xffffffff;
                          auVar20._0_8_ = 0xffffffffffffffff;
                          auVar20._12_4_ = 0xffffffff;
                          auVar73 = packssdw(auVar73 ^ auVar20,auVar73 ^ auVar20);
                          auVar73 = packsswb(auVar73,auVar73);
                          if ((auVar73 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                            pbVar36[-0x78] = true;
                          }
                          auVar100 = pshufhw(auVar68,auVar68,0x84);
                          auVar114 = pshufhw(auVar95,auVar95,0x84);
                          auVar64 = pshufhw(auVar100,auVar109,0x84);
                          auVar69._8_4_ = 0xffffffff;
                          auVar69._0_8_ = 0xffffffffffffffff;
                          auVar69._12_4_ = 0xffffffff;
                          auVar69 = (auVar64 | auVar114 & auVar100) ^ auVar69;
                          auVar100 = packssdw(auVar69,auVar69);
                          auVar100 = packsswb(auVar100,auVar100);
                          if ((auVar100._10_2_ >> 8 & 1) != 0) {
                            pbVar36[-0x60] = true;
                          }
                          auVar100 = (auVar122 | _DAT_0011b470) ^ auVar49;
                          iVar42 = -(uint)(iVar54 < auVar100._0_4_);
                          auVar71._4_4_ = -(uint)(iVar39 < auVar100._4_4_);
                          iVar113 = -(uint)(iVar41 < auVar100._8_4_);
                          auVar71._12_4_ = -(uint)(iVar29 < auVar100._12_4_);
                          auVar96._4_4_ = iVar42;
                          auVar96._0_4_ = iVar42;
                          auVar96._8_4_ = iVar113;
                          auVar96._12_4_ = iVar113;
                          auVar73 = pshuflw(auVar73,auVar96,0xe8);
                          auVar70._4_4_ = -(uint)(auVar100._4_4_ == iVar39);
                          auVar70._12_4_ = -(uint)(auVar100._12_4_ == iVar29);
                          auVar70._0_4_ = auVar70._4_4_;
                          auVar70._8_4_ = auVar70._12_4_;
                          in_XMM7 = pshuflw(auVar78 & auVar77,auVar70,0xe8);
                          in_XMM7 = in_XMM7 & auVar73;
                          auVar71._0_4_ = auVar71._4_4_;
                          auVar71._8_4_ = auVar71._12_4_;
                          auVar73 = pshuflw(auVar73,auVar71,0xe8);
                          auVar116._8_4_ = 0xffffffff;
                          auVar116._0_8_ = 0xffffffffffffffff;
                          auVar116._12_4_ = 0xffffffff;
                          auVar116 = (auVar73 | in_XMM7) ^ auVar116;
                          auVar73 = packssdw(auVar116,auVar116);
                          in_XMM6 = packsswb(auVar73,auVar73);
                          if ((in_XMM6 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                            pbVar36[-0x48] = true;
                          }
                          auVar71 = auVar70 & auVar96 | auVar71;
                          auVar73 = packssdw(auVar71,auVar71);
                          auVar21._8_4_ = 0xffffffff;
                          auVar21._0_8_ = 0xffffffffffffffff;
                          auVar21._12_4_ = 0xffffffff;
                          auVar73 = packssdw(auVar73 ^ auVar21,auVar73 ^ auVar21);
                          auVar73 = packsswb(auVar73,auVar73);
                          if ((auVar73._12_2_ >> 8 & 1) != 0) {
                            pbVar36[-0x30] = true;
                          }
                          auVar73 = (auVar122 | _DAT_0011b460) ^ auVar49;
                          auVar97._0_4_ = -(uint)(iVar54 < auVar73._0_4_);
                          auVar97._4_4_ = -(uint)(iVar39 < auVar73._4_4_);
                          auVar97._8_4_ = -(uint)(iVar41 < auVar73._8_4_);
                          auVar97._12_4_ = -(uint)(iVar29 < auVar73._12_4_);
                          auVar72._4_4_ = auVar97._0_4_;
                          auVar72._0_4_ = auVar97._0_4_;
                          auVar72._8_4_ = auVar97._8_4_;
                          auVar72._12_4_ = auVar97._8_4_;
                          auVar51._4_4_ = -(uint)(auVar73._4_4_ == iVar39);
                          auVar51._12_4_ = -(uint)(auVar73._12_4_ == iVar29);
                          auVar51._0_4_ = auVar51._4_4_;
                          auVar51._8_4_ = auVar51._12_4_;
                          auVar55._4_4_ = auVar97._4_4_;
                          auVar55._0_4_ = auVar97._4_4_;
                          auVar55._8_4_ = auVar97._12_4_;
                          auVar55._12_4_ = auVar97._12_4_;
                          auVar73 = packssdw(auVar97,auVar51 & auVar72 | auVar55);
                          auVar22._8_4_ = 0xffffffff;
                          auVar22._0_8_ = 0xffffffffffffffff;
                          auVar22._12_4_ = 0xffffffff;
                          auVar73 = packssdw(auVar73 ^ auVar22,auVar73 ^ auVar22);
                          auVar73 = packsswb(auVar73,auVar73);
                          if ((auVar73 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0
                             ) {
                            pbVar36[-0x18] = true;
                          }
                          auVar77 = pshufhw(auVar72,auVar72,0x84);
                          auVar73 = pshufhw(auVar51,auVar51,0x84);
                          auVar122 = pshufhw(auVar55,auVar55,0x84);
                          auVar23._8_4_ = 0xffffffff;
                          auVar23._0_8_ = 0xffffffffffffffff;
                          auVar23._12_4_ = 0xffffffff;
                          auVar73 = packssdw(auVar73 & auVar77,
                                             (auVar122 | auVar73 & auVar77) ^ auVar23);
                          auVar73 = packsswb(auVar73,auVar73);
                          if ((auVar73._14_2_ >> 8 & 1) != 0) {
                            *pbVar36 = true;
                          }
                          uVar43 = uVar43 + 0x10;
                          pbVar36 = pbVar36 + 0x180;
                        } while (((iVar32 - lVar40) + 0xfU & 0xfffffffffffffff0) != uVar43);
                      }
                    }
                    else {
                      bVar6 = SQRT((*x - x[(long)iVar41 + -1]) * (*x - x[(long)iVar41 + -1]) +
                                   (*local_160 - local_160[(long)iVar41 + -1]) *
                                   (*local_160 - local_160[(long)iVar41 + -1])) <= radius * 1.72;
                      bVar7 = 0.67 <= dVar46;
                      if ((bVar7 && bVar6) || (local_ec == 1 && 0.25 <= dVar46)) {
                        local_78 = 0.0;
                        dStack_70 = 0.0;
                        local_88 = 0.0;
                        dStack_80 = 0.0;
                        sTheta = 0.0;
                        dStack_90 = 0.0;
                        local_68 = 0.0;
                        bVar27 = EllipseFit(x,local_160,iVar41,(EllipseEquation *)&sTheta,1);
                        if (bVar27) {
                          dVar46 = ComputeEllipseError((EllipseEquation *)&sTheta,x,local_160,iVar41
                                                      );
                          dVar58 = xc;
                          dVar48 = yc;
                          dVar47 = 1.5;
                          if (!bVar7 || !bVar6) {
                            dVar47 = 0.75;
                          }
                          if (dVar46 <= dVar47) {
                            if (bVar24) {
                              iVar29 = (lines->
                                       super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                                       )._M_impl.super__Vector_impl_data._M_start[lVar35].len;
                              x = x + iVar29;
                              local_160 = local_160 + iVar29;
                              iVar41 = iVar41 - iVar29;
                            }
                            else if (bVar45) {
                              iVar41 = iVar41 - (lines->
                                                super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                                                )._M_impl.super__Vector_impl_data._M_start
                                                [this->segmentStartLines[lVar28]].len;
                            }
                            if (bVar7 && bVar6) {
                              addCircle(this->circles1,local_58,xc,yc,dVar26,dVar25,
                                        (EllipseEquation *)&sTheta,dVar46,x,local_160,iVar41);
                            }
                            else {
                              ComputeStartAndEndAngles
                                        (xc,yc,dVar26,x,local_160,iVar41,&eTheta,&eTheta_1);
                              in_XMM7 = (undefined1  [16])0x0;
                              in_XMM6._8_8_ = 0;
                              in_XMM6._0_8_ = dVar46;
                              addArc(this->edarcs1->arcs,&this->edarcs1->noArcs,dVar58,dVar48,dVar26
                                     ,dVar25,eTheta,eTheta_1,this->info[lVar40].sign,iVar54,
                                     (EllipseEquation *)&sTheta,dVar46,(int)*x,(int)*local_160,
                                     (int)x[(long)iVar41 + -1],(int)local_160[(long)iVar41 + -1],x,
                                     local_160,iVar41,0.0);
                            }
                            auVar49 = _DAT_0011b240;
                            if (iVar39 < iVar32) {
                              lVar30 = (iVar32 - lVar40) + -1;
                              auVar50._8_4_ = (int)lVar30;
                              auVar50._0_8_ = lVar30;
                              auVar50._12_4_ = (int)((ulong)lVar30 >> 0x20);
                              pbVar36 = &this->info[lVar40 + 0xf].taken;
                              uVar43 = 0;
                              do {
                                auVar52._8_4_ = (int)uVar43;
                                auVar52._0_8_ = uVar43;
                                auVar52._12_4_ = (int)(uVar43 >> 0x20);
                                auVar56 = auVar50 ^ auVar49;
                                auVar73 = (auVar52 | _DAT_0011b4d0) ^ auVar49;
                                iVar54 = auVar56._0_4_;
                                iVar42 = -(uint)(iVar54 < auVar73._0_4_);
                                iVar39 = auVar56._4_4_;
                                auVar75._4_4_ = -(uint)(iVar39 < auVar73._4_4_);
                                iVar41 = auVar56._8_4_;
                                iVar113 = -(uint)(iVar41 < auVar73._8_4_);
                                iVar29 = auVar56._12_4_;
                                auVar75._12_4_ = -(uint)(iVar29 < auVar73._12_4_);
                                auVar98._4_4_ = iVar42;
                                auVar98._0_4_ = iVar42;
                                auVar98._8_4_ = iVar113;
                                auVar98._12_4_ = iVar113;
                                auVar56 = pshuflw(in_XMM6,auVar98,0xe8);
                                auVar74._4_4_ = -(uint)(auVar73._4_4_ == iVar39);
                                auVar74._12_4_ = -(uint)(auVar73._12_4_ == iVar29);
                                auVar74._0_4_ = auVar74._4_4_;
                                auVar74._8_4_ = auVar74._12_4_;
                                auVar122 = pshuflw(in_XMM7,auVar74,0xe8);
                                auVar75._0_4_ = auVar75._4_4_;
                                auVar75._8_4_ = auVar75._12_4_;
                                auVar73 = pshuflw(auVar56,auVar75,0xe8);
                                auVar117._8_4_ = 0xffffffff;
                                auVar117._0_8_ = 0xffffffffffffffff;
                                auVar117._12_4_ = 0xffffffff;
                                auVar117 = (auVar73 | auVar122 & auVar56) ^ auVar117;
                                auVar73 = packssdw(auVar117,auVar117);
                                if ((auVar73 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                                  pbVar36[-0x168] = true;
                                }
                                auVar75 = auVar74 & auVar98 | auVar75;
                                auVar73 = packssdw(auVar75,auVar75);
                                auVar8._8_4_ = 0xffffffff;
                                auVar8._0_8_ = 0xffffffffffffffff;
                                auVar8._12_4_ = 0xffffffff;
                                auVar73 = packssdw(auVar73 ^ auVar8,auVar73 ^ auVar8);
                                auVar73 = packsswb(auVar73,auVar73);
                                if ((auVar73._0_4_ >> 8 & 1) != 0) {
                                  pbVar36[-0x150] = true;
                                }
                                auVar73 = (auVar52 | _DAT_0011b4c0) ^ auVar49;
                                iVar42 = -(uint)(iVar54 < auVar73._0_4_);
                                auVar110._4_4_ = -(uint)(iVar39 < auVar73._4_4_);
                                iVar113 = -(uint)(iVar41 < auVar73._8_4_);
                                auVar110._12_4_ = -(uint)(iVar29 < auVar73._12_4_);
                                auVar76._4_4_ = iVar42;
                                auVar76._0_4_ = iVar42;
                                auVar76._8_4_ = iVar113;
                                auVar76._12_4_ = iVar113;
                                auVar99._4_4_ = -(uint)(auVar73._4_4_ == iVar39);
                                auVar99._12_4_ = -(uint)(auVar73._12_4_ == iVar29);
                                auVar99._0_4_ = auVar99._4_4_;
                                auVar99._8_4_ = auVar99._12_4_;
                                auVar110._0_4_ = auVar110._4_4_;
                                auVar110._8_4_ = auVar110._12_4_;
                                auVar73 = auVar99 & auVar76 | auVar110;
                                auVar73 = packssdw(auVar73,auVar73);
                                auVar9._8_4_ = 0xffffffff;
                                auVar9._0_8_ = 0xffffffffffffffff;
                                auVar9._12_4_ = 0xffffffff;
                                auVar73 = packssdw(auVar73 ^ auVar9,auVar73 ^ auVar9);
                                auVar73 = packsswb(auVar73,auVar73);
                                if ((auVar73._0_4_ >> 0x10 & 1) != 0) {
                                  pbVar36[-0x138] = true;
                                }
                                auVar77 = pshufhw(auVar76,auVar76,0x84);
                                auVar100 = pshufhw(auVar99,auVar99,0x84);
                                auVar78 = pshufhw(auVar77,auVar110,0x84);
                                auVar79._8_4_ = 0xffffffff;
                                auVar79._0_8_ = 0xffffffffffffffff;
                                auVar79._12_4_ = 0xffffffff;
                                auVar79 = (auVar78 | auVar100 & auVar77) ^ auVar79;
                                auVar77 = packssdw(auVar79,auVar79);
                                auVar77 = packsswb(auVar77,auVar77);
                                if ((auVar77._0_4_ >> 0x18 & 1) != 0) {
                                  pbVar36[-0x120] = true;
                                }
                                auVar77 = (auVar52 | _DAT_0011b4b0) ^ auVar49;
                                iVar42 = -(uint)(iVar54 < auVar77._0_4_);
                                auVar81._4_4_ = -(uint)(iVar39 < auVar77._4_4_);
                                iVar113 = -(uint)(iVar41 < auVar77._8_4_);
                                auVar81._12_4_ = -(uint)(iVar29 < auVar77._12_4_);
                                auVar101._4_4_ = iVar42;
                                auVar101._0_4_ = iVar42;
                                auVar101._8_4_ = iVar113;
                                auVar101._12_4_ = iVar113;
                                auVar73 = pshuflw(auVar73,auVar101,0xe8);
                                auVar80._4_4_ = -(uint)(auVar77._4_4_ == iVar39);
                                auVar80._12_4_ = -(uint)(auVar77._12_4_ == iVar29);
                                auVar80._0_4_ = auVar80._4_4_;
                                auVar80._8_4_ = auVar80._12_4_;
                                auVar122 = pshuflw(auVar122 & auVar56,auVar80,0xe8);
                                auVar81._0_4_ = auVar81._4_4_;
                                auVar81._8_4_ = auVar81._12_4_;
                                auVar56 = pshuflw(auVar73,auVar81,0xe8);
                                auVar118._8_4_ = 0xffffffff;
                                auVar118._0_8_ = 0xffffffffffffffff;
                                auVar118._12_4_ = 0xffffffff;
                                auVar118 = (auVar56 | auVar122 & auVar73) ^ auVar118;
                                auVar56 = packssdw(auVar118,auVar118);
                                auVar56 = packsswb(auVar56,auVar56);
                                if ((auVar56 & (undefined1  [16])0x100000000) !=
                                    (undefined1  [16])0x0) {
                                  pbVar36[-0x108] = true;
                                }
                                auVar81 = auVar80 & auVar101 | auVar81;
                                auVar56 = packssdw(auVar81,auVar81);
                                auVar10._8_4_ = 0xffffffff;
                                auVar10._0_8_ = 0xffffffffffffffff;
                                auVar10._12_4_ = 0xffffffff;
                                auVar56 = packssdw(auVar56 ^ auVar10,auVar56 ^ auVar10);
                                auVar56 = packsswb(auVar56,auVar56);
                                if ((auVar56._4_2_ >> 8 & 1) != 0) {
                                  pbVar36[-0xf0] = true;
                                }
                                auVar56 = (auVar52 | _DAT_0011b4a0) ^ auVar49;
                                iVar42 = -(uint)(iVar54 < auVar56._0_4_);
                                auVar111._4_4_ = -(uint)(iVar39 < auVar56._4_4_);
                                iVar113 = -(uint)(iVar41 < auVar56._8_4_);
                                auVar111._12_4_ = -(uint)(iVar29 < auVar56._12_4_);
                                auVar82._4_4_ = iVar42;
                                auVar82._0_4_ = iVar42;
                                auVar82._8_4_ = iVar113;
                                auVar82._12_4_ = iVar113;
                                auVar102._4_4_ = -(uint)(auVar56._4_4_ == iVar39);
                                auVar102._12_4_ = -(uint)(auVar56._12_4_ == iVar29);
                                auVar102._0_4_ = auVar102._4_4_;
                                auVar102._8_4_ = auVar102._12_4_;
                                auVar111._0_4_ = auVar111._4_4_;
                                auVar111._8_4_ = auVar111._12_4_;
                                auVar56 = auVar102 & auVar82 | auVar111;
                                auVar56 = packssdw(auVar56,auVar56);
                                auVar11._8_4_ = 0xffffffff;
                                auVar11._0_8_ = 0xffffffffffffffff;
                                auVar11._12_4_ = 0xffffffff;
                                auVar56 = packssdw(auVar56 ^ auVar11,auVar56 ^ auVar11);
                                auVar56 = packsswb(auVar56,auVar56);
                                if ((auVar56 & (undefined1  [16])0x1000000000000) !=
                                    (undefined1  [16])0x0) {
                                  pbVar36[-0xd8] = true;
                                }
                                auVar77 = pshufhw(auVar82,auVar82,0x84);
                                auVar100 = pshufhw(auVar102,auVar102,0x84);
                                auVar78 = pshufhw(auVar77,auVar111,0x84);
                                auVar83._8_4_ = 0xffffffff;
                                auVar83._0_8_ = 0xffffffffffffffff;
                                auVar83._12_4_ = 0xffffffff;
                                auVar83 = (auVar78 | auVar100 & auVar77) ^ auVar83;
                                auVar77 = packssdw(auVar83,auVar83);
                                auVar77 = packsswb(auVar77,auVar77);
                                if ((auVar77._6_2_ >> 8 & 1) != 0) {
                                  pbVar36[-0xc0] = true;
                                }
                                auVar77 = (auVar52 | _DAT_0011b490) ^ auVar49;
                                iVar42 = -(uint)(iVar54 < auVar77._0_4_);
                                auVar85._4_4_ = -(uint)(iVar39 < auVar77._4_4_);
                                iVar113 = -(uint)(iVar41 < auVar77._8_4_);
                                auVar85._12_4_ = -(uint)(iVar29 < auVar77._12_4_);
                                auVar103._4_4_ = iVar42;
                                auVar103._0_4_ = iVar42;
                                auVar103._8_4_ = iVar113;
                                auVar103._12_4_ = iVar113;
                                auVar56 = pshuflw(auVar56,auVar103,0xe8);
                                auVar84._4_4_ = -(uint)(auVar77._4_4_ == iVar39);
                                auVar84._12_4_ = -(uint)(auVar77._12_4_ == iVar29);
                                auVar84._0_4_ = auVar84._4_4_;
                                auVar84._8_4_ = auVar84._12_4_;
                                auVar122 = pshuflw(auVar122 & auVar73,auVar84,0xe8);
                                auVar85._0_4_ = auVar85._4_4_;
                                auVar85._8_4_ = auVar85._12_4_;
                                auVar73 = pshuflw(auVar56,auVar85,0xe8);
                                auVar119._8_4_ = 0xffffffff;
                                auVar119._0_8_ = 0xffffffffffffffff;
                                auVar119._12_4_ = 0xffffffff;
                                auVar119 = (auVar73 | auVar122 & auVar56) ^ auVar119;
                                auVar73 = packssdw(auVar119,auVar119);
                                auVar73 = packsswb(auVar73,auVar73);
                                if ((auVar73 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                                  pbVar36[-0xa8] = true;
                                }
                                auVar85 = auVar84 & auVar103 | auVar85;
                                auVar73 = packssdw(auVar85,auVar85);
                                auVar12._8_4_ = 0xffffffff;
                                auVar12._0_8_ = 0xffffffffffffffff;
                                auVar12._12_4_ = 0xffffffff;
                                auVar73 = packssdw(auVar73 ^ auVar12,auVar73 ^ auVar12);
                                auVar73 = packsswb(auVar73,auVar73);
                                if ((auVar73._8_2_ >> 8 & 1) != 0) {
                                  pbVar36[-0x90] = true;
                                }
                                auVar73 = (auVar52 | _DAT_0011b480) ^ auVar49;
                                iVar42 = -(uint)(iVar54 < auVar73._0_4_);
                                auVar112._4_4_ = -(uint)(iVar39 < auVar73._4_4_);
                                iVar113 = -(uint)(iVar41 < auVar73._8_4_);
                                auVar112._12_4_ = -(uint)(iVar29 < auVar73._12_4_);
                                auVar86._4_4_ = iVar42;
                                auVar86._0_4_ = iVar42;
                                auVar86._8_4_ = iVar113;
                                auVar86._12_4_ = iVar113;
                                auVar104._4_4_ = -(uint)(auVar73._4_4_ == iVar39);
                                auVar104._12_4_ = -(uint)(auVar73._12_4_ == iVar29);
                                auVar104._0_4_ = auVar104._4_4_;
                                auVar104._8_4_ = auVar104._12_4_;
                                auVar112._0_4_ = auVar112._4_4_;
                                auVar112._8_4_ = auVar112._12_4_;
                                auVar73 = auVar104 & auVar86 | auVar112;
                                auVar73 = packssdw(auVar73,auVar73);
                                auVar13._8_4_ = 0xffffffff;
                                auVar13._0_8_ = 0xffffffffffffffff;
                                auVar13._12_4_ = 0xffffffff;
                                auVar73 = packssdw(auVar73 ^ auVar13,auVar73 ^ auVar13);
                                auVar73 = packsswb(auVar73,auVar73);
                                if ((auVar73 & (undefined1  [16])0x10000) != (undefined1  [16])0x0)
                                {
                                  pbVar36[-0x78] = true;
                                }
                                auVar77 = pshufhw(auVar86,auVar86,0x84);
                                auVar100 = pshufhw(auVar104,auVar104,0x84);
                                auVar78 = pshufhw(auVar77,auVar112,0x84);
                                auVar87._8_4_ = 0xffffffff;
                                auVar87._0_8_ = 0xffffffffffffffff;
                                auVar87._12_4_ = 0xffffffff;
                                auVar87 = (auVar78 | auVar100 & auVar77) ^ auVar87;
                                auVar77 = packssdw(auVar87,auVar87);
                                auVar77 = packsswb(auVar77,auVar77);
                                if ((auVar77._10_2_ >> 8 & 1) != 0) {
                                  pbVar36[-0x60] = true;
                                }
                                auVar77 = (auVar52 | _DAT_0011b470) ^ auVar49;
                                iVar42 = -(uint)(iVar54 < auVar77._0_4_);
                                auVar89._4_4_ = -(uint)(iVar39 < auVar77._4_4_);
                                iVar113 = -(uint)(iVar41 < auVar77._8_4_);
                                auVar89._12_4_ = -(uint)(iVar29 < auVar77._12_4_);
                                auVar105._4_4_ = iVar42;
                                auVar105._0_4_ = iVar42;
                                auVar105._8_4_ = iVar113;
                                auVar105._12_4_ = iVar113;
                                auVar73 = pshuflw(auVar73,auVar105,0xe8);
                                auVar88._4_4_ = -(uint)(auVar77._4_4_ == iVar39);
                                auVar88._12_4_ = -(uint)(auVar77._12_4_ == iVar29);
                                auVar88._0_4_ = auVar88._4_4_;
                                auVar88._8_4_ = auVar88._12_4_;
                                in_XMM7 = pshuflw(auVar122 & auVar56,auVar88,0xe8);
                                in_XMM7 = in_XMM7 & auVar73;
                                auVar89._0_4_ = auVar89._4_4_;
                                auVar89._8_4_ = auVar89._12_4_;
                                auVar56 = pshuflw(auVar73,auVar89,0xe8);
                                auVar120._8_4_ = 0xffffffff;
                                auVar120._0_8_ = 0xffffffffffffffff;
                                auVar120._12_4_ = 0xffffffff;
                                auVar120 = (auVar56 | in_XMM7) ^ auVar120;
                                auVar56 = packssdw(auVar120,auVar120);
                                in_XMM6 = packsswb(auVar56,auVar56);
                                if ((in_XMM6 & (undefined1  [16])0x100000000) !=
                                    (undefined1  [16])0x0) {
                                  pbVar36[-0x48] = true;
                                }
                                auVar89 = auVar88 & auVar105 | auVar89;
                                auVar56 = packssdw(auVar89,auVar89);
                                auVar14._8_4_ = 0xffffffff;
                                auVar14._0_8_ = 0xffffffffffffffff;
                                auVar14._12_4_ = 0xffffffff;
                                auVar56 = packssdw(auVar56 ^ auVar14,auVar56 ^ auVar14);
                                auVar56 = packsswb(auVar56,auVar56);
                                if ((auVar56._12_2_ >> 8 & 1) != 0) {
                                  pbVar36[-0x30] = true;
                                }
                                auVar56 = (auVar52 | _DAT_0011b460) ^ auVar49;
                                auVar106._0_4_ = -(uint)(iVar54 < auVar56._0_4_);
                                auVar106._4_4_ = -(uint)(iVar39 < auVar56._4_4_);
                                auVar106._8_4_ = -(uint)(iVar41 < auVar56._8_4_);
                                auVar106._12_4_ = -(uint)(iVar29 < auVar56._12_4_);
                                auVar90._4_4_ = auVar106._0_4_;
                                auVar90._0_4_ = auVar106._0_4_;
                                auVar90._8_4_ = auVar106._8_4_;
                                auVar90._12_4_ = auVar106._8_4_;
                                auVar53._4_4_ = -(uint)(auVar56._4_4_ == iVar39);
                                auVar53._12_4_ = -(uint)(auVar56._12_4_ == iVar29);
                                auVar53._0_4_ = auVar53._4_4_;
                                auVar53._8_4_ = auVar53._12_4_;
                                auVar57._4_4_ = auVar106._4_4_;
                                auVar57._0_4_ = auVar106._4_4_;
                                auVar57._8_4_ = auVar106._12_4_;
                                auVar57._12_4_ = auVar106._12_4_;
                                auVar56 = packssdw(auVar106,auVar53 & auVar90 | auVar57);
                                auVar15._8_4_ = 0xffffffff;
                                auVar15._0_8_ = 0xffffffffffffffff;
                                auVar15._12_4_ = 0xffffffff;
                                auVar56 = packssdw(auVar56 ^ auVar15,auVar56 ^ auVar15);
                                auVar56 = packsswb(auVar56,auVar56);
                                if ((auVar56 & (undefined1  [16])0x1000000000000) !=
                                    (undefined1  [16])0x0) {
                                  pbVar36[-0x18] = true;
                                }
                                auVar122 = pshufhw(auVar90,auVar90,0x84);
                                auVar56 = pshufhw(auVar53,auVar53,0x84);
                                auVar73 = pshufhw(auVar57,auVar57,0x84);
                                auVar16._8_4_ = 0xffffffff;
                                auVar16._0_8_ = 0xffffffffffffffff;
                                auVar16._12_4_ = 0xffffffff;
                                auVar56 = packssdw(auVar56 & auVar122,
                                                   (auVar73 | auVar56 & auVar122) ^ auVar16);
                                auVar56 = packsswb(auVar56,auVar56);
                                if ((auVar56._14_2_ >> 8 & 1) != 0) {
                                  *pbVar36 = true;
                                }
                                uVar43 = uVar43 + 0x10;
                                pbVar36 = pbVar36 + 0x180;
                              } while (((iVar32 - lVar40) + 0xfU & 0xfffffffffffffff0) != uVar43);
                            }
                            goto LAB_0010b6a3;
                          }
                        }
                      }
                      if (bVar44) {
                        this->info[lVar40].taken = true;
                      }
                      else if (iVar39 <= iVar32 + -2) {
                        dVar48 = radius * 6.283185307179586;
                        local_48 = circleFitError;
                        while( true ) {
                          Error = 10000000000.0;
                          if (iVar32 < iVar39 + 2) break;
                          local_138 = (long)iVar39;
                          lVar40 = local_138 * 0x48 + 0x40;
                          iVar29 = iVar39 + 4;
                          iVar41 = iVar39 + 2;
                          iVar39 = iVar39 + 3;
                          while( true ) {
                            lVar30 = 0;
                            iVar42 = 0;
                            do {
                              iVar42 = iVar42 + *(int *)((long)&((lines->
                                                  super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->a +
                                                  lVar30 + lVar40);
                              lVar30 = lVar30 + 0x48;
                            } while ((int)lVar30 != 0xd8);
                            CircleFit(x,local_160,iVar42,&sTheta,&eTheta,&eTheta_1,&Error);
                            dVar58 = Error;
                            if (Error <= 1.0) break;
                            iVar42 = (lines->
                                     super__Vector_base<LineSegment,_std::allocator<LineSegment>_>).
                                     _M_impl.super__Vector_impl_data._M_start[local_138].len;
                            x = x + iVar42;
                            local_160 = local_160 + iVar42;
                            local_138 = local_138 + 1;
                            iVar39 = iVar39 + 1;
                            lVar40 = lVar40 + 0x48;
                            iVar29 = iVar29 + 1;
                            bVar45 = iVar41 == iVar32;
                            iVar41 = iVar41 + 1;
                            if (bVar45) goto LAB_0010b6a3;
                          }
                          pIVar1 = this->info;
                          pIVar1[local_138].taken = true;
                          pIVar1[local_138 + 1].taken = true;
                          pIVar1[local_138 + 2].taken = true;
                          if (iVar41 < iVar32) {
                            lVar40 = (long)iVar39;
                            iVar41 = (lines->
                                     super__Vector_base<LineSegment,_std::allocator<LineSegment>_>).
                                     _M_impl.super__Vector_impl_data._M_start[lVar40].len + iVar42;
                            CircleFit(x,local_160,iVar41,&xc_1,&yc_1,&r,&error);
                            if (error <= 1.5) {
                              lVar30 = (long)iVar39 * 0x48 + 0x88;
                              lVar33 = (long)iVar39 * 0x18 + 0x10;
                              do {
                                iVar42 = iVar41;
                                iVar39 = iVar29;
                                dVar58 = error;
                                sTheta = xc_1;
                                eTheta = yc_1;
                                eTheta_1 = r;
                                Error = error;
                                *(undefined1 *)((long)&this->info->sign + lVar33) = 1;
                                if (iVar32 <= lVar40) break;
                                iVar41 = *(int *)((long)&((lines->
                                                  super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->a +
                                                 lVar30) + iVar42;
                                CircleFit(x,local_160,iVar41,&xc_1,&yc_1,&r,&error);
                                lVar30 = lVar30 + 0x48;
                                lVar33 = lVar33 + 0x18;
                                lVar40 = lVar40 + 1;
                                iVar29 = iVar39 + 1;
                              } while (error <= 1.5);
                            }
                          }
                          else {
                            iVar39 = iVar41 + 1;
                          }
                          dVar26 = sTheta;
                          dVar25 = eTheta;
                          if (((double)iVar42 / dVar48 < 0.67) || (1.5 < local_48)) {
                            local_50 = eTheta_1;
                            ComputeStartAndEndAngles
                                      (sTheta,eTheta,eTheta_1,x,local_160,iVar42,&xc_1,&yc_1);
                            addArc(this->edarcs1->arcs,&this->edarcs1->noArcs,dVar26,dVar25,local_50
                                   ,dVar58,xc_1,yc_1,this->info[(int)local_138].sign,iVar54,(int)*x,
                                   (int)*local_160,(int)x[(long)iVar42 + -1],
                                   (int)local_160[(long)iVar42 + -1],x,local_160,iVar42,
                                   in_XMM6._0_8_);
                          }
                          else {
                            pCVar5 = this->circles1;
                            iVar41 = this->noCircles1;
                            pCVar5[iVar41].xc = sTheta;
                            pCVar5[iVar41].yc = eTheta;
                            pCVar5[iVar41].r = eTheta_1;
                            pCVar5[iVar41].circleFitError = dVar58;
                            pCVar5[iVar41].coverRatio =
                                 (double)iVar42 / (eTheta_1 * 6.283185307179586);
                            pCVar5[iVar41].x = x;
                            pCVar5[iVar41].y = local_160;
                            pCVar5[iVar41].noPixels = iVar42;
                            iVar41 = this->noCircles1;
                            pCVar5[iVar41].isEllipse = false;
                            this->noCircles1 = iVar41 + 1;
                          }
                          x = x + iVar42;
                          local_160 = local_160 + iVar42;
                          if (iVar32 + -2 < iVar39) break;
                        }
                      }
                    }
                  }
LAB_0010b6a3:
                  auVar49._8_8_ = 0;
                  auVar49._0_8_ = local_38;
                  iVar41 = iVar32;
                }
              }
LAB_0010b2fb:
              iVar39 = iVar41;
            } while (iVar39 < iVar34);
            iVar54 = (this->super_EDPF).super_ED.segmentNos;
          }
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 < iVar54);
    }
    local_ec = local_ec + 1;
    if (local_ec == 3) {
      return;
    }
  } while( true );
}

Assistant:

void EDCircles::DetectArcs(vector<LineSegment> lines)
{

	double maxLineLengthThreshold = MAX(width, height) / 5;

	double MIN_ANGLE = PI / 30;  // 6 degrees
	double MAX_ANGLE = PI / 3;   // 60 degrees

	for (int iter = 1; iter <= 2; iter++) {
		if (iter == 2) MAX_ANGLE = PI / 1.9;  // 95 degrees
											  //    if (iter == 2) MAX_ANGLE = PI/2.25;  // 80 degrees

		for (int curSegmentNo = 0; curSegmentNo<segmentNos; curSegmentNo++) {
			int firstLine = segmentStartLines[curSegmentNo];
			int stopLine = segmentStartLines[curSegmentNo + 1];

			// We need at least 2 line segments
			if (stopLine - firstLine <= 1) continue;

			// Process the info for the lines of this segment
			while (firstLine < stopLine - 1) {
				// If the line is already taken during the previous step, continue
				if (info[firstLine].taken) { firstLine++; continue; }

				// very long lines cannot be part of an arc
				if (lines[firstLine].len >= maxLineLengthThreshold) { firstLine++; continue; }

				// Skip lines that cannot be part of an arc
				if (info[firstLine].angle < MIN_ANGLE || info[firstLine].angle > MAX_ANGLE) { firstLine++; continue; }

				// Find a group of lines (at least 3) with the same sign & angle < MAX_ANGLE degrees
				int lastLine = firstLine + 1;
				while (lastLine < stopLine - 1) {
					if (info[lastLine].taken) break;
					if (info[lastLine].sign != info[firstLine].sign) break;

					if (lines[lastLine].len >= maxLineLengthThreshold) break; // very long lines cannot be part of an arc
					if (info[lastLine].angle < MIN_ANGLE) break;
					if (info[lastLine].angle > MAX_ANGLE) break;

					lastLine++;
				} //end-while

				bool specialCase = false;
				int wrapCase = -1;  // 1: wrap the first two lines with the last line, 2: wrap the last two lines with the first line
#if 0
									// If we do not have 3 lines, then continue
				if (lastLine - firstLine <= 1) { firstLine = lastLine; continue; }
#else
									//        if (lastLine-firstLine == 0){firstLine=lastLine; continue;}
				if (lastLine - firstLine == 1) {
					// Just 2 lines. If long enough, then try to combine. Angle between 15 & 45 degrees. Min. length = 40
					int totalLineLength = lines[firstLine].len + lines[firstLine + 1].len;
					int shorterLen = lines[firstLine].len;
					int longerLen = lines[firstLine + 1].len;

					if (lines[firstLine + 1].len < shorterLen) {
						shorterLen = lines[firstLine + 1].len;
						longerLen = lines[firstLine].len;
					} //end-if

					if (info[firstLine].angle >= PI / 12 && info[firstLine].angle <= PI / 4 && totalLineLength >= 40 && shorterLen * 2 >= longerLen) {
						specialCase = true;
					} //end-if

					  // If the two lines do not make up for arc generation, then try to wrap the lines to the first OR last line.
					  // There are two wrapper cases: 
					if (specialCase == false) {
						// Case 1: Combine the first two lines with the last line of the segment
						if (firstLine == segmentStartLines[curSegmentNo] && info[stopLine - 1].angle >= MIN_ANGLE && info[stopLine - 1].angle <= MAX_ANGLE) {
							wrapCase = 1;
							specialCase = true;
						} //end-if            

						  // Case 2: Combine the last two lines with the first line of the segment
						else if (lastLine == stopLine - 1 && info[lastLine].angle >= MIN_ANGLE && info[lastLine].angle <= MAX_ANGLE) {
							wrapCase = 2;
							specialCase = true;
						} //end-if            
					} // end-if

					  // If still not enough for arc generation, then skip
					if (specialCase == false) {
						firstLine = lastLine;
						continue;
					} //end-else
				} //end-if
#endif

				  // Copy the pixels of this segment to an array
				int noPixels = 0;
				double *x = bm->getX();
				double *y = bm->getY();

				// wrapCase 1: Combine the first two lines with the last line of the segment
				if (wrapCase == 1) {
					int index = lines[stopLine - 1].firstPixelIndex;

					for (int n = 0; n<lines[stopLine - 1].len; n++) {
						x[noPixels] = segmentPoints[curSegmentNo][index + n].x;
						y[noPixels] = segmentPoints[curSegmentNo][index + n].y;
						noPixels++;
					} //end-for
				} //end-if

				for (int m = firstLine; m <= lastLine; m++) {
					int index = lines[m].firstPixelIndex;

					for (int n = 0; n<lines[m].len; n++) {
						x[noPixels] = segmentPoints[curSegmentNo][index + n].x;
						y[noPixels] = segmentPoints[curSegmentNo][index + n].y;
						noPixels++;
					} //end-for
				} //end-for

				  // wrapCase 2: Combine the last two lines with the first line of the segment
				if (wrapCase == 2) {
					int index = lines[segmentStartLines[curSegmentNo]].firstPixelIndex;

					for (int n = 0; n<lines[segmentStartLines[curSegmentNo]].len; n++) {
						x[noPixels] = segmentPoints[curSegmentNo][index + n].x;
						y[noPixels] = segmentPoints[curSegmentNo][index + n].y;
						noPixels++;
					} //end-for
				} //end-if

				  // Move buffer pointers
				bm->move(noPixels);

				// Try to fit a circle to the entire arc of lines
				double xc, yc, radius, circleFitError;
				CircleFit(x, y, noPixels, &xc, &yc, &radius, &circleFitError);

				double coverage = noPixels / (TWOPI*radius);

				// In the case of the special case, the arc must cover at least 22.5 degrees
				if (specialCase && coverage < 1.0 / 16) { info[firstLine].taken = true; firstLine = lastLine; continue; }

				// If only 3 lines, use the SHORT_ARC_ERROR
				double MYERROR = SHORT_ARC_ERROR;
				if (lastLine - firstLine >= 3) MYERROR = LONG_ARC_ERROR;
				if (circleFitError <= MYERROR) {
					// Add this to the list of arcs
					if (wrapCase == 1) {
						x += lines[stopLine - 1].len;
						y += lines[stopLine - 1].len;
						noPixels -= lines[stopLine - 1].len;

					}
					else if (wrapCase == 2) {
						noPixels -= lines[segmentStartLines[curSegmentNo]].len;
					} //end-else

					if ((coverage >= FULL_CIRCLE_RATIO && circleFitError <= LONG_ARC_ERROR)) {
						addCircle(circles1, noCircles1, xc, yc, radius, circleFitError, x, y, noPixels);

					}
					else {
						double sTheta, eTheta;
						ComputeStartAndEndAngles(xc, yc, radius, x, y, noPixels, &sTheta, &eTheta);

						addArc(edarcs1->arcs, edarcs1->noArcs, xc, yc, radius, circleFitError, sTheta, eTheta, info[firstLine].sign, curSegmentNo,
							(int)x[0], (int)y[0], (int)x[noPixels - 1], (int)y[noPixels - 1], x, y, noPixels);
					} //end-else

					for (int m = firstLine; m<lastLine; m++) info[m].taken = true;
					firstLine = lastLine;
					continue;
				} //end-if

				  // Check if this is an almost closed loop (i.e, if 60% of the circle is present). If so, try to fit an ellipse to the entire arc of lines
				double dx = x[0] - x[noPixels - 1];
				double dy = y[0] - y[noPixels - 1];
				double distanceBetweenEndPoints = sqrt(dx*dx + dy*dy);

				bool isAlmostClosedLoop = (distanceBetweenEndPoints <= 1.72*radius && coverage >= FULL_CIRCLE_RATIO);
				if (isAlmostClosedLoop || (iter == 1 && coverage >= 0.25)) {  // an arc covering at least 90 degrees
					EllipseEquation eq;
					double ellipseFitError = 1e10;

					bool valid = EllipseFit(x, y, noPixels, &eq);
					if (valid) ellipseFitError = ComputeEllipseError(&eq, x, y, noPixels);

					MYERROR = ELLIPSE_ERROR;
					if (isAlmostClosedLoop == false) MYERROR = 0.75;

					if (ellipseFitError <= MYERROR) {
						// Add this to the list of arcs
						if (wrapCase == 1) {
							x += lines[stopLine - 1].len;
							y += lines[stopLine - 1].len;
							noPixels -= lines[stopLine - 1].len;

						}
						else if (wrapCase == 2) {
							noPixels -= lines[segmentStartLines[curSegmentNo]].len;
						} //end-else

						if (isAlmostClosedLoop) {
							addCircle(circles1, noCircles1, xc, yc, radius, circleFitError, &eq, ellipseFitError, x, y, noPixels);  // Add an ellipse for validation

						}
						else {
							double sTheta, eTheta;
							ComputeStartAndEndAngles(xc, yc, radius, x, y, noPixels, &sTheta, &eTheta);

							addArc(edarcs1->arcs, edarcs1->noArcs,  xc, yc, radius, circleFitError, sTheta, eTheta, info[firstLine].sign, curSegmentNo, &eq, ellipseFitError,
								(int)x[0], (int)y[0], (int)x[noPixels - 1], (int)y[noPixels - 1], x, y, noPixels);
						} //end-else

						for (int m = firstLine; m<lastLine; m++) info[m].taken = true;
						firstLine = lastLine;
						continue;
					} //end-if
				} //end-if

				if (specialCase) { info[firstLine].taken = true; firstLine = lastLine; continue; }

				// Continue until we finish all lines that belong to arc of lines
				while (firstLine <= lastLine - 2) {
					// Fit an initial arc and extend it
					int curLine = firstLine + 2;

					// Fit a circle to the pixels of these lines and see if the error is less than a threshold
					double XC, YC, R, Error = 1e10;
					bool found = false;

					noPixels = 0;
					while (curLine <= lastLine) {
						noPixels = 0;
						for (int m = firstLine; m <= curLine; m++) noPixels += lines[m].len;

						// Fit circle
						CircleFit(x, y, noPixels, &XC, &YC, &R, &Error);
						if (Error <= SHORT_ARC_ERROR) { found = true; break; } // found if the error is smaller than the threshold

																			   // Not found. Move to the next set of lines
						x += lines[firstLine].len;
						y += lines[firstLine].len;

						firstLine++;
						curLine++;
					} //end-while

					  // If no initial arc found, then we are done with this arc of lines
					if (!found) break;

					// If we found an initial arc, then extend it
					for (int m = curLine - 2; m <= curLine; m++) info[m].taken = true;
					curLine++;
					while (curLine <= lastLine) {
						int index = lines[curLine].firstPixelIndex;
						int noPixelsSave = noPixels;

						noPixels += lines[curLine].len;

						double xc, yc, r, error;
						CircleFit(x, y, noPixels, &xc, &yc, &r, &error);
						if (error > LONG_ARC_ERROR) { noPixels = noPixelsSave; break; }   // Adding this line made the error big. So, we do not use this line

																						  // OK. Longer arc
						XC = xc;
						YC = yc;
						R = r;
						Error = error;

						info[curLine].taken = true;
						curLine++;
					} //end-while

					double coverage = noPixels / (TWOPI*radius);
					if ((coverage >= FULL_CIRCLE_RATIO && circleFitError <= LONG_ARC_ERROR)) {
						addCircle(circles1, noCircles1, XC, YC, R, Error, x, y, noPixels);

					}
					else {
						// Add this to the list of arcs
						double sTheta, eTheta;
						ComputeStartAndEndAngles(XC, YC, R, x, y, noPixels, &sTheta, &eTheta);

						addArc(edarcs1->arcs, edarcs1->noArcs, XC, YC, R, Error, sTheta, eTheta, info[firstLine].sign, curSegmentNo,
							(int)x[0], (int)y[0], (int)x[noPixels - 1], (int)y[noPixels - 1], x, y, noPixels);
					} //end-else

					x += noPixels;
					y += noPixels;

					firstLine = curLine;
				} //end-while-current-arc-of-lines

				firstLine = lastLine;
			} //end-while-entire-edge-segment
		} //end-for
	} //end-for-iter
}